

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O2

void __thiscall Fl_Input_Choice::resize(Fl_Input_Choice *this,int X,int Y,int W,int H)

{
  Fl_Input *pFVar1;
  InputMenuButton *pIVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
  pFVar1 = this->inp_;
  uVar3 = inp_x(this);
  uVar4 = inp_y(this);
  uVar5 = inp_w(this);
  uVar6 = inp_h(this);
  (*(pFVar1->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[4])
            (pFVar1,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  pIVar2 = this->menu_;
  uVar3 = menu_x(this);
  uVar4 = menu_y(this);
  uVar5 = menu_h(this);
  UNRECOVERED_JUMPTABLE =
       (pIVar2->super_Fl_Menu_Button).super_Fl_Menu_.super_Fl_Widget._vptr_Fl_Widget[4];
  (*UNRECOVERED_JUMPTABLE)(pIVar2,(ulong)uVar3,(ulong)uVar4,0x14,(ulong)uVar5,UNRECOVERED_JUMPTABLE)
  ;
  return;
}

Assistant:

void resize(int X, int Y, int W, int H) {
    Fl_Group::resize(X,Y,W,H);
    inp_->resize(inp_x(), inp_y(), inp_w(), inp_h());
    menu_->resize(menu_x(), menu_y(), menu_w(), menu_h());
  }